

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unqlite.c
# Opt level: O0

int lhRestoreSpace(lhpage *pPage,sxu16 iOfft,sxu16 nByte)

{
  uchar *buf;
  uchar *zRaw;
  sxu16 nByte_local;
  sxu16 iOfft_local;
  lhpage *pPage_local;
  
  if (3 < nByte) {
    buf = pPage->pRaw->zData + iOfft;
    SyBigEndianPack16(buf,(pPage->sHdr).iFree);
    SyBigEndianPack16(buf + 2,nByte);
    SyBigEndianPack16(pPage->pRaw->zData + 2,iOfft);
    (pPage->sHdr).iFree = iOfft;
    pPage->nFree = pPage->nFree + nByte;
  }
  return 0;
}

Assistant:

static int lhRestoreSpace(lhpage *pPage,sxu16 iOfft,sxu16 nByte)
{
	unsigned char *zRaw;
	if( nByte < 4 ){
		/* At least 4 bytes of freespace must form a valid block */
		return UNQLITE_OK;
	}
	/* pEngine->pIo->xWrite() has been successfully called on this page */
	zRaw = &pPage->pRaw->zData[iOfft];
	/* Mark as a free block */
	SyBigEndianPack16(zRaw,pPage->sHdr.iFree); /* Offset of the next free block */
	zRaw += 2;
	SyBigEndianPack16(zRaw,nByte);
	/* Link */
	SyBigEndianPack16(&pPage->pRaw->zData[2/* offset of the first cell */],iOfft);
	pPage->sHdr.iFree = iOfft;
	pPage->nFree += nByte;
	return UNQLITE_OK;
}